

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_ObjSetGateLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  
  iVar2 = Gia_ObjIsBuf(pObj);
  if (iVar2 != 0) {
    Gia_ObjSetBufLevel(p,pObj);
    return;
  }
  iVar2 = Gia_ObjIsMux(p,pObj);
  if (iVar2 == 0) {
    iVar2 = Gia_ObjIsXor(pObj);
    uVar1 = *(ulong *)pObj;
    if (iVar2 == 0) {
      if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar1 < 0) {
        return;
      }
      iVar2 = Gia_ObjLevel(p,pObj + -(uVar1 & 0x1fffffff));
      iVar3 = Gia_ObjLevel(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
      if (iVar2 <= iVar3) {
        iVar2 = iVar3;
      }
      iVar2 = iVar2 + 1;
      goto LAB_005e1538;
    }
    iVar2 = Gia_ObjLevel(p,pObj + -(uVar1 & 0x1fffffff));
    pObj_00 = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  else {
    iVar2 = Gia_ObjIsMux(p,pObj);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsMux(p,pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x210,"void Gia_ObjSetMuxLevel(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = Gia_ObjLevel(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
    iVar3 = Gia_ObjLevel(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    if (iVar2 <= iVar3) {
      iVar2 = iVar3;
    }
    pObj_00 = Gia_ObjFanin2(p,pObj);
  }
  iVar3 = Gia_ObjLevel(p,pObj_00);
  if (iVar2 <= iVar3) {
    iVar2 = iVar3;
  }
  iVar2 = iVar2 + 2;
LAB_005e1538:
  Gia_ObjSetLevel(p,pObj,iVar2);
  return;
}

Assistant:

static inline void         Gia_ObjSetGateLevel( Gia_Man_t * p, Gia_Obj_t * pObj ){ if ( Gia_ObjIsBuf(pObj) ) Gia_ObjSetBufLevel(p, pObj); else if ( Gia_ObjIsMux(p,pObj) ) Gia_ObjSetMuxLevel(p, pObj); else if ( Gia_ObjIsXor(pObj) ) Gia_ObjSetXorLevel(p, pObj); else if ( Gia_ObjIsAnd(pObj) ) Gia_ObjSetAndLevel(p, pObj); }